

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Bech32.cpp
# Opt level: O0

void __thiscall
Bech32Test_expand_hrp_Test::~Bech32Test_expand_hrp_Test(Bech32Test_expand_hrp_Test *this)

{
  Bech32Test_expand_hrp_Test *this_local;
  
  ~Bech32Test_expand_hrp_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Bech32Test, expand_hrp) {
    std::string hrp("ABC");
    std::vector<unsigned char> e = expandHrp(hrp);
    ASSERT_EQ(e[0], '\x02');
    ASSERT_EQ(e[1], '\x02');
    ASSERT_EQ(e[2], '\x02');
    ASSERT_EQ(e[3], '\x00');
    ASSERT_EQ(e[4], '\x01');
    ASSERT_EQ(e[5], '\x02');
    ASSERT_EQ(e[6], '\x03');
}